

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::TParseContext::transparentOpaqueCheck
          (TParseContext *this,TSourceLoc *loc,TType *type,TString *identifier)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  if ((this->super_TParseContextBase).parsingBuiltins == false) {
    iVar1 = (*type->_vptr_TType[0xb])(type);
    if ((*(uint *)(CONCAT44(extraout_var,iVar1) + 8) & 0x7f) == 5) {
      iVar1 = (*type->_vptr_TType[0x39])(type);
      if ((char)iVar1 != '\0') {
        if ((0 < (this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkan) &&
           ((this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkanRelaxed == false))
        {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x29])
                    (this,loc,"non-opaque uniforms outside a block");
        }
        if (0 < (this->super_TParseContextBase).super_TParseVersions.spvVersion.openGl) {
          iVar1 = (*type->_vptr_TType[0xb])(type);
          if (((~*(uint *)(CONCAT44(extraout_var_00,iVar1) + 0x1c) & 0xfff) == 0) &&
             (((this->super_TParseContextBase).super_TParseVersions.intermediate)->autoMapLocations
              == false)) {
            UNRECOVERED_JUMPTABLE =
                 (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
            (*UNRECOVERED_JUMPTABLE)
                      (this,loc,"non-opaque uniform variables need a layout(location=L)",
                       (identifier->_M_dataplus)._M_p,"",UNRECOVERED_JUMPTABLE);
            return;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void TParseContext::transparentOpaqueCheck(const TSourceLoc& loc, const TType& type, const TString& identifier)
{
    if (parsingBuiltins)
        return;

    if (type.getQualifier().storage != EvqUniform)
        return;

    if (type.containsNonOpaque()) {
        // Vulkan doesn't allow transparent uniforms outside of blocks
        if (spvVersion.vulkan > 0 && !spvVersion.vulkanRelaxed)
            vulkanRemoved(loc, "non-opaque uniforms outside a block");
        // OpenGL wants locations on these (unless they are getting automapped)
        if (spvVersion.openGl > 0 && !type.getQualifier().hasLocation() && !intermediate.getAutoMapLocations())
            error(loc, "non-opaque uniform variables need a layout(location=L)", identifier.c_str(), "");
    }
}